

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

char * BuildArrayDimsName(char *base_name,int type,int element_size)

{
  size_t sVar1;
  char *__s;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  char *Ret;
  size_t Len;
  
  sVar1 = strlen(in_RDI);
  __s = (char *)malloc(sVar1 + 0x17);
  snprintf(__s,sVar1 + 0x17,"SST%d_%d_",(ulong)in_EDX,(ulong)in_ESI);
  strcat(__s,in_RDI);
  strcat(__s,"Dims");
  return __s;
}

Assistant:

static char *BuildArrayDimsName(const char *base_name, const int type, const int element_size)
{
    size_t Len = strlen(base_name) + 3 + strlen("SST_") + 16;
    char *Ret = malloc(Len);
    snprintf(Ret, Len, "SST%d_%d_", element_size, type);
    strcat(Ret, base_name);
    strcat(Ret, "Dims");
    return Ret;
}